

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructionHeuristics.cpp
# Opt level: O2

Solution * ConstructionHeuristics::randomIteration(Solution *solution)

{
  Turn *this;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int __n;
  ulong uVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar5;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar6;
  pointer ppTVar7;
  Scenario *this_00;
  WeekData *this_01;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_02;
  string *psVar8;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_03;
  ShiftType *this_04;
  mapped_type *this_05;
  const_reference ppDVar9;
  int iVar10;
  _Tuple_impl<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>_>
  _Var11;
  const_iterator iter;
  vector<Turn_*,_std::allocator<Turn_*>_> day;
  type random;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
  local_80;
  pointer local_78;
  vector<Turn_*,_std::allocator<Turn_*>_> *local_70;
  pointer local_68;
  pointer local_60;
  _Vector_base<Turn_*,_std::allocator<Turn_*>_> local_58;
  _Bind<std::uniform_int_distribution<int>_(std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>)>
  local_40;
  
  uVar4 = std::chrono::_V2::system_clock::now();
  iVar3 = (int)((uVar4 & 0xffffffff) % 0x7fffffff);
  _Var11.
  super__Head_base<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_false>
  ._M_head_impl._M_x._0_4_ = iVar3 + (uint)(iVar3 == 0);
  _Var11.
  super__Head_base<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_false>
  ._M_head_impl._M_x._4_4_ = 0;
  pmVar5 = Solution::getNurses_abi_cxx11_(solution);
  local_40._M_f._M_param =
       (param_type)
       (((pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count << 0x20) + -0x100000000);
  local_40._M_bound_args.
  super__Tuple_impl<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>_>
  .
  super__Head_base<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_false>
  ._M_head_impl._M_x =
       (_Tuple_impl<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>_>
        )(_Tuple_impl<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>_>
          )_Var11.
           super__Head_base<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_false>
           ._M_head_impl._M_x;
  pvVar6 = Solution::getTurns(solution);
  local_70 = (pvVar6->
             super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_78 = (pvVar6->
             super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (local_70 == local_78) {
      return solution;
    }
    std::vector<Turn_*,_std::allocator<Turn_*>_>::vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)&local_58,local_70);
    local_68 = local_58._M_impl.super__Vector_impl_data._M_finish;
    ppTVar7 = local_58._M_impl.super__Vector_impl_data._M_start;
    while (ppTVar7 != local_68) {
      this = *ppTVar7;
      local_60 = ppTVar7;
      this_00 = Scenario::getInstance();
      this_01 = Scenario::getWeekData(this_00);
      this_02 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)WeekData::getRequirements_abi_cxx11_(this_01);
      psVar8 = Turn::getSkill_abi_cxx11_(this);
      this_03 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::at(this_02,psVar8);
      this_04 = Turn::getShiftType(this);
      psVar8 = ShiftType::getId_abi_cxx11_(this_04);
      this_05 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::at(this_03,psVar8);
      uVar2 = Turn::getDay(this);
      ppDVar9 = std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>::at
                          (this_05,(ulong)uVar2);
      iVar3 = DayRequirement::getMinimumCoverage(*ppDVar9);
      uVar4 = 0;
      for (iVar10 = 0; iVar10 < iVar3; iVar10 = iVar10 + (uint)bVar1) {
        pmVar5 = Solution::getNurses_abi_cxx11_(solution);
        local_80._M_node = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        __n = std::
              _Bind<std::uniform_int_distribution<int>(std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>)>
              ::operator()(&local_40);
        std::
        advance<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,NurseSolution*>>,int>
                  (&local_80,__n);
        bVar1 = Solution::assignNurseToTurn(solution,*(NurseSolution **)(local_80._M_node + 2),this)
        ;
        pmVar5 = Solution::getNurses_abi_cxx11_(solution);
        if ((pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count * 2 <= uVar4) {
          std::_Vector_base<Turn_*,_std::allocator<Turn_*>_>::~_Vector_base(&local_58);
          return (Solution *)0x0;
        }
        uVar4 = uVar4 + 1;
      }
      ppTVar7 = local_60 + 1;
    }
    std::_Vector_base<Turn_*,_std::allocator<Turn_*>_>::~_Vector_base(&local_58);
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

Solution* ConstructionHeuristics::randomIteration(Solution * solution) {
    default_random_engine generator((unsigned int) chrono::system_clock::now().time_since_epoch().count());
    uniform_int_distribution<int> distribution(0, (int) solution->getNurses().size()-1);

    auto random = bind(distribution, generator);

    for (vector<Turn *> day : solution->getTurns())
        for (Turn *turn : day) {
            int requiredNurses = Scenario::getInstance()->getWeekData().getRequirements().at(turn->getSkill()).at(turn->getShiftType()->getId()).at((unsigned int)turn->getDay())->getMinimumCoverage();
            int loop = 0;
            for(int i = 0; i < requiredNurses;i++)
            {
                loop++;
                auto iter = solution->getNurses().begin();
                std::advance( iter, random() );
                if(!solution->assignNurseToTurn(iter->second, turn))
                    i--;
                if(loop > solution->getNurses().size()*2)
                    return nullptr;
            }
        }
    return solution;
}